

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

PipelineResourceLayoutDescX * __thiscall
Diligent::PipelineResourceLayoutDescX::SyncDesc
          (PipelineResourceLayoutDescX *this,bool UpdateStrings)

{
  bool bVar1;
  size_type sVar2;
  Char *pCVar3;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar4;
  ImmutableSamplerDesc *local_b0;
  ShaderResourceVariableDesc *local_a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  undefined1 local_80;
  reference local_78;
  ImmutableSamplerDesc *Sam;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  *__range3_1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  undefined1 local_40;
  reference local_38;
  ShaderResourceVariableDesc *Var;
  iterator __end3;
  iterator __begin3;
  vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  *__range3;
  bool UpdateStrings_local;
  PipelineResourceLayoutDescX *this_local;
  
  sVar2 = std::
          vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
          ::size(&this->VarCopy);
  (this->super_PipelineResourceLayoutDesc).NumVariables = (Uint32)sVar2;
  if ((this->super_PipelineResourceLayoutDesc).NumVariables == 0) {
    local_a8 = (ShaderResourceVariableDesc *)0x0;
  }
  else {
    local_a8 = std::
               vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
               ::data(&this->VarCopy);
  }
  (this->super_PipelineResourceLayoutDesc).Variables = local_a8;
  sVar2 = std::
          vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
          size(&this->ImtblSamCopy);
  (this->super_PipelineResourceLayoutDesc).NumImmutableSamplers = (Uint32)sVar2;
  if ((this->super_PipelineResourceLayoutDesc).NumImmutableSamplers == 0) {
    local_b0 = (ImmutableSamplerDesc *)0x0;
  }
  else {
    local_b0 = std::
               vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ::data(&this->ImtblSamCopy);
  }
  (this->super_PipelineResourceLayoutDesc).ImmutableSamplers = local_b0;
  if (UpdateStrings) {
    __end3 = std::
             vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
             ::begin(&this->VarCopy);
    Var = (ShaderResourceVariableDesc *)
          std::
          vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
          ::end(&this->VarCopy);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
                                       *)&Var), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
                 ::operator*(&__end3);
      pVar4 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->StringPool,&local_38->Name);
      local_48._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_40 = pVar4.second;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_48);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      local_38->Name = pCVar3;
      __gnu_cxx::
      __normal_iterator<Diligent::ShaderResourceVariableDesc_*,_std::vector<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
               ::begin(&this->ImtblSamCopy);
    Sam = (ImmutableSamplerDesc *)
          std::
          vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
          end(&this->ImtblSamCopy);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
                               *)&Sam), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
                 ::operator*(&__end3_1);
      pVar4 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->StringPool,&local_78->SamplerOrTextureName);
      local_88._M_cur =
           (__node_type *)
           pVar4.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_80 = pVar4.second;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_88);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      local_78->SamplerOrTextureName = pCVar3;
      __gnu_cxx::
      __normal_iterator<Diligent::ImmutableSamplerDesc_*,_std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>_>
      ::operator++(&__end3_1);
    }
  }
  return this;
}

Assistant:

PipelineResourceLayoutDescX& SyncDesc(bool UpdateStrings = false)
    {
        NumVariables = static_cast<Uint32>(VarCopy.size());
        Variables    = NumVariables > 0 ? VarCopy.data() : nullptr;

        NumImmutableSamplers = static_cast<Uint32>(ImtblSamCopy.size());
        ImmutableSamplers    = NumImmutableSamplers > 0 ? ImtblSamCopy.data() : nullptr;

        if (UpdateStrings)
        {
            for (auto& Var : VarCopy)
                Var.Name = StringPool.emplace(Var.Name).first->c_str();

            for (auto& Sam : ImtblSamCopy)
                Sam.SamplerOrTextureName = StringPool.emplace(Sam.SamplerOrTextureName).first->c_str();
        }

        return *this;
    }